

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnTryTableCatch(TypeChecker *this,TypeVector *sig,Index depth)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *in_RCX;
  string local_88;
  string local_68;
  Enum local_48;
  Enum local_44;
  _anonymous_namespace_ *local_40;
  TypeVector *label_sig;
  Label *local_30;
  Label *label;
  Result result;
  Index depth_local;
  TypeVector *sig_local;
  TypeChecker *this_local;
  
  label._4_4_ = depth;
  _result = (_anonymous_namespace_ *)sig;
  Result::Result((Result *)&label,Ok);
  label_sig._4_4_ = GetLabel(this,label._4_4_,&local_30);
  bVar1 = Failed(label_sig._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_40 = (_anonymous_namespace_ *)Label::br_types(local_30);
    local_44 = (Enum)CheckTypes(this,(TypeVector *)local_40,(TypeVector *)_result);
    Result::operator|=((Result *)&label,(Result)local_44);
    local_48 = label._0_4_;
    bVar1 = Failed(label._0_4_);
    if (bVar1) {
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_68,_result,(TypeVector *)0x0,in_RCX);
      uVar2 = std::__cxx11::string::c_str();
      (anonymous_namespace)::TypesToString_abi_cxx11_(&local_88,local_40,(TypeVector *)0x0,in_RCX);
      uVar3 = std::__cxx11::string::c_str();
      PrintError(this,"catch signature doesn\'t match target: expected %s, got %s",uVar2,uVar3);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
    }
    this_local._4_4_ = label._0_4_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnTryTableCatch(const TypeVector& sig, Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckTypes(label_sig, sig);
  if (Failed(result)) {
    PrintError("catch signature doesn't match target: expected %s, got %s",
               TypesToString(sig).c_str(), TypesToString(label_sig).c_str());
  }
  return result;
}